

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileImporter.cpp
# Opt level: O1

void __thiscall
Assimp::XFileImporter::ConvertMaterials
          (XFileImporter *this,aiScene *pScene,
          vector<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_> *pMaterials)

{
  pointer pMVar1;
  char cVar2;
  aiMaterial **__src;
  pointer pcVar3;
  pointer pTVar4;
  undefined1 *puVar5;
  bool *pbVar6;
  aiMaterial **__dest;
  pointer pMVar7;
  aiMaterial *this_00;
  ulong uVar8;
  Logger *this_01;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  pointer pTVar13;
  int iVar14;
  uint uVar15;
  size_t sVar16;
  size_t sVar17;
  bool bVar18;
  int shadeMode;
  string sz;
  aiString name;
  aiString tex;
  uint local_8a8;
  uint local_8a4;
  uint local_8a0;
  uint local_89c;
  uint local_898;
  int local_884;
  undefined1 *local_880;
  ulong local_878;
  undefined1 local_870 [16];
  vector<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_> *local_860;
  aiScene *local_858;
  ulong local_850;
  ulong local_848;
  aiString local_840;
  aiString local_438;
  
  pMVar7 = (pMaterials->
           super__Vector_base<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)(pMaterials->
                super__Vector_base<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar7;
  if (lVar9 == 0) {
    iVar14 = 0;
  }
  else {
    uVar10 = (lVar9 >> 4) * 0x6db6db6db6db6db7;
    pbVar6 = &pMVar7->mIsReference;
    iVar14 = 0;
    uVar11 = 1;
    do {
      iVar14 = iVar14 + (*pbVar6 ^ 1);
      pbVar6 = pbVar6 + 0x70;
      bVar18 = uVar11 <= uVar10;
      lVar9 = uVar10 - uVar11;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (bVar18 && lVar9 != 0);
  }
  if (iVar14 != 0) {
    __src = pScene->mMaterials;
    uVar15 = pScene->mNumMaterials;
    __dest = (aiMaterial **)operator_new__((ulong)(iVar14 + uVar15) << 3);
    pScene->mMaterials = __dest;
    if (__src != (aiMaterial **)0x0) {
      memcpy(__dest,__src,(ulong)uVar15 << 3);
      operator_delete__(__src);
    }
  }
  pMVar7 = (pMaterials->
           super__Vector_base<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((pMaterials->
      super__Vector_base<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>)._M_impl
      .super__Vector_impl_data._M_finish != pMVar7) {
    local_850 = 0;
    local_860 = pMaterials;
    local_858 = pScene;
    do {
      pMVar1 = pMVar7 + local_850;
      if (pMVar7[local_850].mIsReference == true) {
        if (pScene->mNumMaterials != 0) {
          sVar16 = 0;
          do {
            local_840.length = 0;
            local_840.data[0] = '\0';
            memset(local_840.data + 1,0x1b,0x3ff);
            aiGetMaterialString(pScene->mMaterials[sVar16],"?mat.name",0,0,&local_840);
            iVar14 = strcmp(local_840.data,(pMVar1->mName)._M_dataplus._M_p);
            if (iVar14 == 0) {
              pMVar1->sceneIndex = sVar16;
              break;
            }
            sVar16 = sVar16 + 1;
          } while (sVar16 < pScene->mNumMaterials);
        }
        if (pMVar1->sceneIndex == 0xffffffffffffffff) {
          this_01 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[46]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_840,(char (*) [46])"Could not resolve global material reference \"");
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_840,(pMVar1->mName)._M_dataplus._M_p,
                     (pMVar1->mName)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_840,"\"",1);
          std::__cxx11::stringbuf::str();
          Logger::warn(this_01,(char *)CONCAT44(local_438.data._0_4_,local_438.length));
          if ((undefined1 *)CONCAT44(local_438.data._0_4_,local_438.length) != local_438.data + 0xc)
          {
            operator_delete((undefined1 *)CONCAT44(local_438.data._0_4_,local_438.length));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_840);
          std::ios_base::~ios_base((ios_base *)(local_840.data + 0x6c));
          pMVar1->sceneIndex = 0;
          pMaterials = local_860;
        }
      }
      else {
        this_00 = (aiMaterial *)operator_new(0x10);
        aiMaterial::aiMaterial(this_00);
        local_840.length = 0;
        local_840.data[0] = '\0';
        memset(local_840.data + 1,0x1b,0x3ff);
        uVar11 = (pMVar1->mName)._M_string_length;
        if (uVar11 < 0x400) {
          local_840.length = (ai_uint32)uVar11;
          memcpy(local_840.data,(pMVar1->mName)._M_dataplus._M_p,uVar11);
          local_840.data[uVar11] = '\0';
        }
        aiMaterial::AddProperty(this_00,&local_840,"?mat.name",0,0);
        local_884 = 3 - (uint)((int)pMVar1->mSpecularExponent == 0);
        aiMaterial::AddBinaryProperty(this_00,&local_884,4,"$mat.shadingm",0,0,aiPTI_Integer);
        aiMaterial::AddBinaryProperty
                  (this_00,&pMVar1->mEmissive,0xc,"$clr.emissive",0,0,aiPTI_Float);
        aiMaterial::AddBinaryProperty(this_00,&pMVar1->mDiffuse,0x10,"$clr.diffuse",0,0,aiPTI_Float)
        ;
        aiMaterial::AddBinaryProperty
                  (this_00,&pMVar1->mSpecular,0xc,"$clr.specular",0,0,aiPTI_Float);
        aiMaterial::AddBinaryProperty
                  (this_00,&pMVar1->mSpecularExponent,4,"$mat.shininess",0,0,aiPTI_Float);
        pTVar13 = (pMVar1->mTextures).
                  super__Vector_base<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if ((long)pTVar13 -
            (long)(pMVar1->mTextures).
                  super__Vector_base<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x28) {
          if (pTVar13[-1].mName._M_string_length != 0) {
            uVar11 = pTVar13[-1].mName._M_string_length;
            sVar17 = uVar11 & 0xffffffff;
            if ((uVar11 & 0xfffffc00) != 0) {
              sVar17 = 0x3ff;
            }
            local_438.length = (ai_uint32)sVar17;
            memcpy(local_438.data,pTVar13[-1].mName._M_dataplus._M_p,sVar17);
            local_438.data[sVar17] = '\0';
            aiMaterial::AddProperty
                      (this_00,&local_438,"$tex.file",
                       (uint)pTVar13[-1].mIsNormalMap + (uint)pTVar13[-1].mIsNormalMap * 4 + 1,0);
          }
        }
        else {
          pTVar13 = (pMVar1->mTextures).
                    super__Vector_base<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((pMVar1->mTextures).
              super__Vector_base<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>.
              _M_impl.super__Vector_impl_data._M_finish != pTVar13) {
            uVar11 = 0;
            local_8a4 = 0;
            local_8a0 = 0;
            local_89c = 0;
            local_8a8 = 0;
            local_898 = 0;
            uVar15 = 0;
            do {
              local_880 = local_870;
              pcVar3 = pTVar13[uVar11].mName._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_880,pcVar3,pcVar3 + pTVar13[uVar11].mName._M_string_length
                        );
              if (local_878 != 0) {
                uVar8 = std::__cxx11::string::find_last_of
                                  ((char *)&local_880,0x6cb96e,0xffffffffffffffff);
                uVar10 = 0;
                if (uVar8 != 0xffffffffffffffff) {
                  uVar10 = uVar8;
                }
                lVar9 = std::__cxx11::string::rfind((char)(string *)&local_880,0x2e);
                if (lVar9 != -1) {
                  local_880[lVar9] = 0;
                }
                local_848 = uVar10;
                if (local_878 != 0) {
                  uVar12 = 1;
                  uVar10 = 0;
                  do {
                    puVar5 = local_880;
                    cVar2 = local_880[uVar10];
                    iVar14 = isalpha((int)cVar2);
                    if (iVar14 != 0) {
                      iVar14 = tolower((int)cVar2);
                      puVar5[uVar10] = (char)iVar14;
                    }
                    uVar10 = (ulong)uVar12;
                    uVar12 = uVar12 + 1;
                  } while (uVar10 < local_878);
                }
                pTVar4 = (pMVar1->mTextures).
                         super__Vector_base<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar10 = pTVar4[uVar11].mName._M_string_length;
                sVar17 = uVar10 & 0xffffffff;
                if ((uVar10 & 0xfffffc00) != 0) {
                  sVar17 = 0x3ff;
                }
                local_438.length = (ai_uint32)sVar17;
                memcpy(local_438.data,pTVar4[uVar11].mName._M_dataplus._M_p,sVar17);
                uVar10 = local_848;
                local_438.data[sVar17] = '\0';
                lVar9 = std::__cxx11::string::find((char *)&local_880,0x6bf9bd,local_848);
                if ((lVar9 == -1) &&
                   (lVar9 = std::__cxx11::string::find((char *)&local_880,0x6c5797,uVar10),
                   lVar9 == -1)) {
                  if ((pTVar13[uVar11].mIsNormalMap == false) &&
                     ((lVar9 = std::__cxx11::string::find((char *)&local_880,0x6deb58,uVar10),
                      lVar9 == -1 &&
                      (lVar9 = std::__cxx11::string::find((char *)&local_880,0x706484,uVar10),
                      lVar9 == -1)))) {
                    lVar9 = std::__cxx11::string::find((char *)&local_880,0x6e2d76,uVar10);
                    if ((lVar9 == -1) &&
                       (lVar9 = std::__cxx11::string::find((char *)&local_880,0x706487,uVar10),
                       lVar9 == -1)) {
                      lVar9 = std::__cxx11::string::find((char *)&local_880,0x70648d,uVar10);
                      if ((lVar9 == -1) &&
                         (lVar9 = std::__cxx11::string::find((char *)&local_880,0x706492,uVar10),
                         lVar9 == -1)) {
                        lVar9 = std::__cxx11::string::find((char *)&local_880,0x6be852,uVar10);
                        if ((lVar9 == -1) &&
                           (lVar9 = std::__cxx11::string::find((char *)&local_880,0x706496,uVar10),
                           lVar9 == -1)) {
                          aiMaterial::AddProperty(this_00,&local_438,"$tex.file",1,local_8a8);
                          local_8a8 = local_8a8 + 1;
                        }
                        else {
                          aiMaterial::AddProperty(this_00,&local_438,"$tex.file",4,local_8a4);
                          local_8a4 = local_8a4 + 1;
                        }
                      }
                      else {
                        aiMaterial::AddProperty(this_00,&local_438,"$tex.file",3,local_8a0);
                        local_8a0 = local_8a0 + 1;
                      }
                    }
                    else {
                      aiMaterial::AddProperty(this_00,&local_438,"$tex.file",2,local_89c);
                      local_89c = local_89c + 1;
                    }
                  }
                  else {
                    aiMaterial::AddProperty(this_00,&local_438,"$tex.file",6,local_898);
                    local_898 = local_898 + 1;
                  }
                }
                else {
                  aiMaterial::AddProperty(this_00,&local_438,"$tex.file",5,uVar15);
                  uVar15 = uVar15 + 1;
                }
              }
              if (local_880 != local_870) {
                operator_delete(local_880);
              }
              uVar11 = (ulong)((int)uVar11 + 1);
              pTVar13 = (pMVar1->mTextures).
                        super__Vector_base<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar10 = ((long)(pMVar1->mTextures).
                              super__Vector_base<Assimp::XFile::TexEntry,_std::allocator<Assimp::XFile::TexEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar13 >> 3) *
                       -0x3333333333333333;
            } while (uVar11 <= uVar10 && uVar10 - uVar11 != 0);
          }
        }
        local_858->mMaterials[local_858->mNumMaterials] = this_00;
        pMVar1->sceneIndex = (ulong)local_858->mNumMaterials;
        local_858->mNumMaterials = local_858->mNumMaterials + 1;
        pScene = local_858;
        pMaterials = local_860;
      }
      local_850 = (ulong)((int)local_850 + 1);
      pMVar7 = (pMaterials->
               super__Vector_base<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar11 = ((long)(pMaterials->
                      super__Vector_base<Assimp::XFile::Material,_std::allocator<Assimp::XFile::Material>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pMVar7 >> 4) *
               0x6db6db6db6db6db7;
    } while (local_850 <= uVar11 && uVar11 - local_850 != 0);
  }
  return;
}

Assistant:

void XFileImporter::ConvertMaterials( aiScene* pScene, std::vector<XFile::Material>& pMaterials)
{
    // count the non-referrer materials in the array
    unsigned int numNewMaterials( 0 );
    for ( unsigned int a = 0; a < pMaterials.size(); ++a ) {
        if ( !pMaterials[ a ].mIsReference ) {
            ++numNewMaterials;
        }
    }

    // resize the scene's material list to offer enough space for the new materials
    if( numNewMaterials > 0 ) {
        aiMaterial** prevMats = pScene->mMaterials;
        pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials + numNewMaterials];
        if( nullptr != prevMats)  {
            ::memcpy( pScene->mMaterials, prevMats, pScene->mNumMaterials * sizeof( aiMaterial*));
            delete [] prevMats;
        }
    }

    // convert all the materials given in the array
    for( unsigned int a = 0; a < pMaterials.size(); ++a ) {
        XFile::Material& oldMat = pMaterials[a];
        if( oldMat.mIsReference) {
            // find the material it refers to by name, and store its index
            for( size_t a = 0; a < pScene->mNumMaterials; ++a ) {
                aiString name;
                pScene->mMaterials[a]->Get( AI_MATKEY_NAME, name);
                if( strcmp( name.C_Str(), oldMat.mName.data()) == 0 ) {
                    oldMat.sceneIndex = a;
                    break;
                }
            }

            if( oldMat.sceneIndex == SIZE_MAX ) {
                ASSIMP_LOG_WARN_F( "Could not resolve global material reference \"", oldMat.mName, "\"" );
                oldMat.sceneIndex = 0;
            }

            continue;
        }

        aiMaterial* mat = new aiMaterial;
        aiString name;
        name.Set( oldMat.mName);
        mat->AddProperty( &name, AI_MATKEY_NAME);

        // Shading model: hard-coded to PHONG, there is no such information in an XFile
        // FIX (aramis): If the specular exponent is 0, use gouraud shading. This is a bugfix
        // for some models in the SDK (e.g. good old tiny.x)
        int shadeMode = (int)oldMat.mSpecularExponent == 0.0f
            ? aiShadingMode_Gouraud : aiShadingMode_Phong;

        mat->AddProperty<int>( &shadeMode, 1, AI_MATKEY_SHADING_MODEL);
        // material colours
        // Unclear: there's no ambient colour, but emissive. What to put for ambient?
        // Probably nothing at all, let the user select a suitable default.
        mat->AddProperty( &oldMat.mEmissive, 1, AI_MATKEY_COLOR_EMISSIVE);
        mat->AddProperty( &oldMat.mDiffuse, 1, AI_MATKEY_COLOR_DIFFUSE);
        mat->AddProperty( &oldMat.mSpecular, 1, AI_MATKEY_COLOR_SPECULAR);
        mat->AddProperty( &oldMat.mSpecularExponent, 1, AI_MATKEY_SHININESS);


        // texture, if there is one
        if (1 == oldMat.mTextures.size() ) {
            const XFile::TexEntry& otex = oldMat.mTextures.back();
            if (otex.mName.length()) {
                // if there is only one texture assume it contains the diffuse color
                aiString tex( otex.mName);
                if ( otex.mIsNormalMap ) {
                    mat->AddProperty( &tex, AI_MATKEY_TEXTURE_NORMALS( 0 ) );
                } else {
                    mat->AddProperty( &tex, AI_MATKEY_TEXTURE_DIFFUSE( 0 ) );
                }
            }
        } else {
            // Otherwise ... try to search for typical strings in the
            // texture's file name like 'bump' or 'diffuse'
            unsigned int iHM = 0,iNM = 0,iDM = 0,iSM = 0,iAM = 0,iEM = 0;
            for( unsigned int b = 0; b < oldMat.mTextures.size(); ++b ) {
                const XFile::TexEntry& otex = oldMat.mTextures[b];
                std::string sz = otex.mName;
                if ( !sz.length() ) {
                    continue;
                }

                // find the file name
                std::string::size_type s = sz.find_last_of("\\/");
                if ( std::string::npos == s ) {
                    s = 0;
                }

                // cut off the file extension
                std::string::size_type sExt = sz.find_last_of('.');
                if (std::string::npos != sExt){
                    sz[sExt] = '\0';
                }

                // convert to lower case for easier comparison
                for ( unsigned int c = 0; c < sz.length(); ++c ) {
                    if ( isalpha( sz[ c ] ) ) {
                        sz[ c ] = tolower( sz[ c ] );
                    }
                }

                // Place texture filename property under the corresponding name
                aiString tex( oldMat.mTextures[b].mName);

                // bump map
                if (std::string::npos != sz.find("bump", s) || std::string::npos != sz.find("height", s)) {
                    mat->AddProperty( &tex, AI_MATKEY_TEXTURE_HEIGHT(iHM++));
                } else if (otex.mIsNormalMap || std::string::npos != sz.find( "normal", s) || std::string::npos != sz.find("nm", s)) {
                    mat->AddProperty( &tex, AI_MATKEY_TEXTURE_NORMALS(iNM++));
                } else if (std::string::npos != sz.find( "spec", s) || std::string::npos != sz.find( "glanz", s)) {
                    mat->AddProperty( &tex, AI_MATKEY_TEXTURE_SPECULAR(iSM++));
                } else if (std::string::npos != sz.find( "ambi", s) || std::string::npos != sz.find( "env", s)) {
                    mat->AddProperty( &tex, AI_MATKEY_TEXTURE_AMBIENT(iAM++));
                } else if (std::string::npos != sz.find( "emissive", s) || std::string::npos != sz.find( "self", s)) {
                    mat->AddProperty( &tex, AI_MATKEY_TEXTURE_EMISSIVE(iEM++));
                } else {
                    // Assume it is a diffuse texture
                    mat->AddProperty( &tex, AI_MATKEY_TEXTURE_DIFFUSE(iDM++));
                }
            }
        }

        pScene->mMaterials[pScene->mNumMaterials] = mat;
        oldMat.sceneIndex = pScene->mNumMaterials;
        pScene->mNumMaterials++;
    }
}